

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

bool fmt::v8::detail::check_char_specs<char,fmt::v8::detail::error_handler>
               (basic_format_specs<char> *specs,error_handler *eh)

{
  char spec;
  bool bVar1;
  
  spec = specs->type;
  if ((spec == '\0') || (spec == 'c')) {
    if (((*(ushort *)&specs->field_0x9 & 0xf) == 4) ||
       (bVar1 = true, (*(ushort *)&specs->field_0x9 & 0xf0) != 0)) {
      error_handler::on_error(eh,"invalid format specifier for char");
    }
  }
  else {
    check_int_type_spec<fmt::v8::detail::error_handler&>(spec,eh);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

FMT_CONSTEXPR auto check_char_specs(const basic_format_specs<Char>& specs,
                                    ErrorHandler&& eh = {}) -> bool {
  if (specs.type && specs.type != 'c') {
    check_int_type_spec(specs.type, eh);
    return false;
  }
  if (specs.align == align::numeric || specs.sign != sign::none || specs.alt)
    eh.on_error("invalid format specifier for char");
  return true;
}